

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlk.cpp
# Opt level: O1

int __thiscall
pg::ZLKSolver::attractPar
          (ZLKSolver *this,WorkerP *__lace_worker,Task *__lace_dq_head,int i,int r,
          vector<int,_std::allocator<int>_> *R)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  Worker *pWVar4;
  iterator __position;
  uint uVar5;
  ostream *poVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_type __n;
  TD_attractParT *t;
  Task *pTVar11;
  long lVar12;
  int iVar13;
  int *__args;
  bool bVar14;
  uint local_50;
  
  uVar9 = (ulong)(uint)i;
  uVar1 = ((this->super_Solver).game)->_priority[i];
  uVar5 = lace_workers();
  lVar12 = pvec;
  uVar10 = (ulong)uVar5;
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      **(undefined4 **)(lVar12 + uVar8 * 8) = 0;
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  if (i < 0) {
    iVar13 = 0;
  }
  else {
    local_50 = uVar1 & 1;
    piVar3 = *(int **)(pvec + (ulong)__lace_worker->worker * 8);
    iVar13 = 0;
    uVar9 = (ulong)(uint)i;
    do {
      uVar7 = this->region[uVar9];
      if (uVar7 < 0x80000001) {
LAB_00148c7e:
        bVar14 = false;
      }
      else if ((this->to_inversion != false) ||
              (bVar14 = true, ((this->super_Solver).game)->_priority[uVar9] == uVar1)) {
        if ((((this->super_Solver).game)->_priority[uVar9] & 1U) == local_50) {
          if (iVar13 == 0) {
            this->region[uVar9] = r;
LAB_00148d81:
            this->winning[uVar9] = local_50;
            this->strategy[uVar9] = -1;
            iVar2 = *piVar3;
            *piVar3 = iVar2 + 1;
            piVar3[(long)iVar2 + 1] = (int)uVar9;
            if (__lace_worker->end == __lace_dq_head) {
              lace_abort_stack_overflow();
            }
            __lace_dq_head->f = attractParT_WRAP;
            (__lace_dq_head->thief)._M_b._M_p = (__pointer_type)0x1;
            *(uint *)__lace_dq_head->d = local_50;
            *(int *)(__lace_dq_head->d + 4) = (int)uVar9;
            *(int *)(__lace_dq_head->d + 8) = r;
            *(ZLKSolver **)(__lace_dq_head->d + 0x10) = this;
            pWVar4 = __lace_worker->_public;
            if (__lace_worker->allstolen == '\0') {
              if (pWVar4->movesplit != '\0') {
                uVar7 = (uint)((int)((ulong)((long)__lace_dq_head - (long)__lace_worker->dq) >> 6) +
                               2 + (int)((ulong)((long)__lace_worker->split -
                                                (long)__lace_worker->dq) >> 6)) >> 1;
                LOCK();
                *(uint *)((long)&pWVar4->ts + 4) = uVar7;
                UNLOCK();
                __lace_worker->split = __lace_worker->dq + uVar7;
                pWVar4->movesplit = '\0';
              }
            }
            else {
              if (pWVar4->movesplit != '\0') {
                pWVar4->movesplit = '\0';
              }
              uVar8 = (long)__lace_dq_head - (long)__lace_worker->dq;
              LOCK();
              pWVar4->ts = (TailSplit)
                           ((uVar8 >> 6 & 0xffffffff | (uVar8 & 0xffffffffffffffc0) << 0x1a) +
                           0x100000000);
              UNLOCK();
              pWVar4->allstolen = '\0';
              __lace_worker->split = __lace_dq_head + 1;
              __lace_worker->allstolen = '\0';
            }
            __lace_dq_head = __lace_dq_head + 1;
            iVar13 = iVar13 + 1;
          }
          else {
            do {
              LOCK();
              bVar14 = uVar7 == this->region[uVar9];
              if (bVar14) {
                this->region[uVar9] = r;
              }
              UNLOCK();
              if (bVar14) {
                if (r != -0x7fffffff) goto LAB_00148d81;
                break;
              }
              uVar7 = this->region[uVar9];
            } while ((int)uVar7 < 0);
          }
          goto LAB_00148c7e;
        }
        bVar14 = true;
        for (; iVar13 != 0; iVar13 = iVar13 + -1) {
          pTVar11 = __lace_dq_head + -1;
          if ((__lace_worker->_public->movesplit == '\0') && (__lace_worker->split <= pTVar11)) {
            __lace_dq_head[-1].thief._M_b._M_p = (__pointer_type)0x0;
            attractParT(*(ZLKSolver **)(__lace_dq_head[-1].d + 0x10),__lace_worker,pTVar11,
                        *(int *)__lace_dq_head[-1].d,*(int *)(__lace_dq_head[-1].d + 4),
                        *(int *)(__lace_dq_head[-1].d + 8));
          }
          else {
            attractParT_SYNC_SLOW(__lace_worker,pTVar11);
          }
          __lace_dq_head = pTVar11;
        }
        iVar13 = 0;
      }
      if (bVar14) goto joined_r0x00148e8c;
      bVar14 = 0 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar14);
    uVar9 = 0xffffffff;
  }
joined_r0x00148e8c:
  for (; iVar13 != 0; iVar13 = iVar13 + -1) {
    pTVar11 = __lace_dq_head + -1;
    if ((__lace_worker->_public->movesplit == '\0') && (__lace_worker->split <= pTVar11)) {
      __lace_dq_head[-1].thief._M_b._M_p = (__pointer_type)0x0;
      attractParT(*(ZLKSolver **)(__lace_dq_head[-1].d + 0x10),__lace_worker,pTVar11,
                  *(int *)__lace_dq_head[-1].d,*(int *)(__lace_dq_head[-1].d + 4),
                  *(int *)(__lace_dq_head[-1].d + 8));
    }
    else {
      attractParT_SYNC_SLOW(__lace_worker,pTVar11);
    }
    __lace_dq_head = pTVar11;
  }
  __n = (long)(R->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(R->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start >> 2;
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      __n = __n + (long)**(int **)(pvec + uVar8 * 8);
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  std::vector<int,_std::allocator<int>_>::reserve(R,__n);
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      piVar3 = *(int **)(pvec + uVar8 * 8);
      if (0 < *piVar3) {
        lVar12 = 0;
        __args = piVar3;
        do {
          __args = __args + 1;
          if (1 < (this->super_Solver).trace) {
            poVar6 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"attracted ",10);
            poVar6 = (ostream *)std::ostream::operator<<(poVar6,*__args);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
            poVar6 = (ostream *)
                     std::ostream::operator<<
                               (poVar6,((this->super_Solver).game)->_priority[*__args]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
            std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
          }
          __position._M_current =
               (R->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
          if (__position._M_current ==
              (R->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)R,__position,__args);
          }
          else {
            *__position._M_current = *__args;
            (R->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < *piVar3);
      }
      *piVar3 = 0;
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar10);
  }
  return (int)uVar9;
}

Assistant:

int
ZLKSolver::attractPar(WorkerP* __lace_worker, Task* __lace_dq_head, int i, int r, std::vector<int>* R)
{
    const int pr = priority(i);
    const int pl = pr & 1;

    // initialize pvec (set count to 0) for all workers
    const int W = lace_workers();
    for (int j=0; j<W; j++) pvec[j]->count = 0;

    par_helper* ours = pvec[LACE_WORKER_ID];
    int spawn_count = 0;

    for (; i>=0; i--) {
        int _r = region[i];
        if (_r == DIS or _r >= 0) continue; // not in subgame or attracted
        if (!to_inversion and priority(i) != pr) break;
        if ((priority(i)&1) != pl) { // search until parity inversion
            // first SYNC on all children, who knows this node may be attracted
            while (spawn_count) { SYNC(attractParT); spawn_count--; }
            // after SYNC, check if node <i> is now attracted.
            if (_r < 0) break; // not attracted, so we're done!
            else continue; // already done
        }

        // if c != 0, then we compete with attractParT and must use compare and swap
        if (spawn_count == 0) {
            region[i] = r; // just set, no competing threads
        } else {
            // competing threads! use compare and swap [in a loop]
            while (true) {
                if (__sync_bool_compare_and_swap(&region[i], _r, r)) {
                    _r = r;
                    break;
                }
                _r = *(volatile int*)&region[i];
                if (_r < 0) continue;
                _r = BOT;
                break;
            }
            if (_r == BOT) continue; // someone else claimed!
        }

        winning[i] = pl;
        strategy[i] = -1; // head nodes have no strategy (for now)
        ours->items[ours->count++] = i;
        SPAWN(attractParT, pl, i, r, this);
        spawn_count++;
    }

    // first SYNC on all children (if any)
    while (spawn_count) { SYNC(attractParT); spawn_count--; }

    // update R
    size_t to_reserve = R->size();
    for (int j=0; j<W; j++) to_reserve += pvec[j]->count;
    R->reserve(to_reserve);

    for (int j=0; j<W; j++) {
        par_helper* x = pvec[j];
        for (int k=0; k<x->count; k++) {
#ifndef NDEBUG
            if (trace >= 2) logger << "attracted " << x->items[k] << " (" << priority(x->items[k]) << ")" << std::endl;
#endif
            R->push_back(x->items[k]);
        }
        x->count = 0;
    }

    return i;
}